

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

void __thiscall mocker::detail::RegisterAllocator::allocate(RegisterAllocator *this)

{
  __node_base_ptr *pp_Var1;
  bool bVar2;
  __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  string *psVar3;
  ostream *poVar4;
  shared_ptr<mocker::nasm::Register> *reg;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range3;
  __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
  local_220;
  __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
  local_218;
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_210;
  int local_1d4;
  undefined1 local_1d0 [96];
  undefined1 local_170 [8];
  RegMap<Node> coloring;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  toBeSpilled;
  function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> local_118;
  anon_class_8_1_8991fb9c local_f8;
  function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> local_f0;
  LineIter local_d0;
  LineIter local_c8;
  function<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&)>
  local_c0;
  function<bool_(const_std::shared_ptr<mocker::nasm::Register>_&)> local_a0;
  function<void_(const_std::shared_ptr<mocker::nasm::Register>_&)> local_80;
  _List_node_base *local_50;
  _List_node_base *local_48;
  undefined1 local_40 [8];
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  nonPrecolored;
  anon_class_8_1_8991fb9c freezeMoves;
  anon_class_8_1_8991fb9c isMoveRelated;
  anon_class_8_1_8991fb9c enableMoves;
  RegisterAllocator *this_local;
  
  nonPrecolored.
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  freezeMoves.this = this;
  isMoveRelated.this = this;
  do {
    local_48 = (this->funcBeg)._M_node;
    local_50 = (this->funcEnd)._M_node;
    getNonPrecoloredNodes
              ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                *)local_40,(LineIter)local_48,(LineIter)local_50);
    InterferenceGraph::clearAndInit
              (&this->interG,
               (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                *)local_40);
    std::function<void(std::shared_ptr<mocker::nasm::Register>const&)>::
    function<mocker::detail::RegisterAllocator::allocate()::__0&,void>
              ((function<void(std::shared_ptr<mocker::nasm::Register>const&)> *)&local_80,
               &isMoveRelated);
    std::function<bool(std::shared_ptr<mocker::nasm::Register>const&)>::
    function<mocker::detail::RegisterAllocator::allocate()::__1&,void>
              ((function<bool(std::shared_ptr<mocker::nasm::Register>const&)> *)&local_a0,
               &freezeMoves);
    std::
    function<std::vector<std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>(std::shared_ptr<mocker::nasm::Register>const&)>
    ::function<mocker::detail::RegisterAllocator::allocate()::__2&,void>
              ((function<std::vector<std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>(std::shared_ptr<mocker::nasm::Register>const&)>
                *)&local_c0,
               (anon_class_8_1_8991fb9c *)
               &nonPrecolored.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    InterferenceGraph::bindFunctions(&this->interG,&local_80,&local_a0,&local_c0);
    std::
    function<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&)>
    ::~function(&local_c0);
    std::function<bool_(const_std::shared_ptr<mocker::nasm::Register>_&)>::~function(&local_a0);
    std::function<void_(const_std::shared_ptr<mocker::nasm::Register>_&)>::~function(&local_80);
    MoveInfo::clearAndInit
              (&this->moveInfo,
               (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                *)local_40);
    local_c8._M_node = (this->funcBeg)._M_node;
    local_d0._M_node = (this->funcEnd)._M_node;
    local_f8.this = this;
    std::function<void(std::shared_ptr<mocker::nasm::Mov>const&)>::
    function<mocker::detail::RegisterAllocator::allocate()::__3,void>
              ((function<void(std::shared_ptr<mocker::nasm::Mov>const&)> *)&local_f0,&local_f8);
    toBeSpilled.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
    std::function<void(std::shared_ptr<mocker::nasm::Mov>const&)>::
    function<mocker::detail::RegisterAllocator::allocate()::__4,void>
              ((function<void(std::shared_ptr<mocker::nasm::Mov>const&)> *)&local_118,
               (anon_class_8_1_8991fb9c *)
               &toBeSpilled.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    InterferenceGraph::build(&this->interG,local_c8,local_d0,&local_f0,&local_118);
    std::function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)>::~function(&local_118);
    std::function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)>::~function(&local_f0);
    InterferenceGraph::initWorklists
              (&this->interG,
               (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                *)local_40);
    do {
      do {
        bVar2 = InterferenceGraph::simplify(&this->interG);
      } while (bVar2);
      bVar2 = coalesce(this);
    } while (((bVar2) || (bVar2 = InterferenceGraph::freezeNode(&this->interG), bVar2)) ||
            (bVar2 = InterferenceGraph::spill(&this->interG), bVar2));
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              *)&coloring._M_h._M_single_bucket);
    std::
    unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
    ::unordered_map((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                     *)local_170);
    InterferenceGraph::assignColors
              ((pair<std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>_>
                *)(local_1d0 + 0x10),&this->interG);
    std::
    tie<std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::unordered_map<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>const,std::shared_ptr<mocker::nasm::Register>>>>>
              ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                *)local_1d0,
               (unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                *)&coloring._M_h._M_single_bucket);
    std::
    tuple<std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>&,std::unordered_map<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>const,std::shared_ptr<mocker::nasm::Register>>>>&>
    ::operator=((tuple<std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>&,std::unordered_map<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>const,std::shared_ptr<mocker::nasm::Register>>>>&>
                 *)local_1d0,
                (pair<std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>_>
                 *)(local_1d0 + 0x10));
    std::
    pair<std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>_>
    ::~pair((pair<std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>_>
             *)(local_1d0 + 0x10));
    bVar2 = std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::empty((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&coloring._M_h._M_single_bucket);
    if (bVar2) {
      color(this,(RegMap<Node> *)local_170);
      local_1d4 = 3;
    }
    else {
      pp_Var1 = &coloring._M_h._M_single_bucket;
      local_218._M_current =
           (shared_ptr<mocker::nasm::Register> *)
           std::
           vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)pp_Var1);
      local_220._M_current =
           (shared_ptr<mocker::nasm::Register> *)
           std::
           vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  *)pp_Var1);
      std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator
                ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)((long)&__range3 + 5));
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
      ::
      unordered_set<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
                ((unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
                  *)&local_210,local_218,local_220,0,(hasher *)((long)&__range3 + 7),
                 (key_equal *)((long)&__range3 + 6),
                 (allocator<std::shared_ptr<mocker::nasm::Register>_> *)((long)&__range3 + 5));
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::operator=(&this->spilledLastTime,&local_210);
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::~unordered_set(&local_210);
      std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)((long)&__range3 + 5));
      std::operator<<((ostream *)&std::cerr,"\nto be spilled: ");
      pp_Var1 = &coloring._M_h._M_single_bucket;
      __end3 = std::
               vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        *)pp_Var1);
      reg = (shared_ptr<mocker::nasm::Register> *)
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)pp_Var1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                                         *)&reg), bVar2) {
        this_00 = (__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                     ::operator*(&__end3);
        this_01 = std::
                  __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_00);
        psVar3 = nasm::Register::getIdentifier_abi_cxx11_(this_01);
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)psVar3);
        std::operator<<(poVar4,", ");
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
        ::operator++(&__end3);
      }
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      rewriteProgram(this,(vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           *)&coloring._M_h._M_single_bucket);
      local_1d4 = 0;
    }
    std::
    unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
    ::~unordered_map((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                      *)local_170);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               *)&coloring._M_h._M_single_bucket);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               *)local_40);
  } while (local_1d4 == 0);
  return;
}

Assistant:

void RegisterAllocator::allocate() {
  auto enableMoves = [this](const Node &n) {
    auto movs = moveInfo.getCurAssociatedMoves(n);
    for (auto &mov : movs)
      moveInfo.enableMove(mov);
  };
  auto isMoveRelated = [this](const Node &n) {
    return moveInfo.isMoveRelated(n);
  };
  auto freezeMoves = [this](const Node &n) { return moveInfo.freezeMoves(n); };

  while (true) {
    auto nonPrecolored = getNonPrecoloredNodes(funcBeg, funcEnd);
    interG.clearAndInit(nonPrecolored);
    interG.bindFunctions(enableMoves, isMoveRelated, freezeMoves);
    moveInfo.clearAndInit(nonPrecolored);

    interG.build(
        funcBeg, funcEnd,
        [this](const MovInst &mov) { moveInfo.pushWorklist(mov); },
        [this](const MovInst &mov) { moveInfo.updateAssociatedMoves(mov); });
    interG.initWorklists(nonPrecolored);

    while (true) {
      if (interG.simplify())
        continue;
      if (coalesce())
        continue;
      if (interG.freezeNode())
        continue;
      if (interG.spill())
        continue;
      break;
    }

    std::vector<Node> toBeSpilled;
    RegMap<Node> coloring;
    std::tie(toBeSpilled, coloring) = interG.assignColors();
    if (toBeSpilled.empty()) {
      color(coloring);
      break;
    }
    spilledLastTime = RegSet(toBeSpilled.begin(), toBeSpilled.end());
    std::cerr << "\nto be spilled: ";
    for (auto &reg : toBeSpilled)
      std::cerr << reg->getIdentifier() << ", ";
    std::cerr << std::endl;
    rewriteProgram(toBeSpilled);
  }
}